

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableElimination.cpp
# Opt level: O0

uint __thiscall
Inferences::ALASCA::
PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
::partitionSize(PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                *this,bool lhs)

{
  IterTraits<Lib::RangeIterator<unsigned_int>_> i;
  uint uVar1;
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  *in_RDI;
  IterTraits<Lib::RangeIterator<unsigned_int>_> IVar2;
  IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:182:15),_false>_>
  *this_00;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  uint in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  *in_stack_ffffffffffffffc8;
  anon_class_16_2_633b91a4_for__func in_stack_ffffffffffffffd0;
  
  Lib::
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  ::size(in_RDI);
  IVar2 = Lib::$_0::operator()
                    ((anon_class_1_0_00000001 *)
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
  i._iter._from = in_stack_ffffffffffffff84;
  i._iter._next = in_stack_ffffffffffffff80;
  i._iter._to = IVar2._iter._next;
  Lib::iterTraits<Lib::IterTraits<Lib::RangeIterator<unsigned_int>>>(i);
  this_00 = (IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:182:15),_false>_>
             *)&stack0xffffffffffffffc8;
  Lib::IterTraits<Lib::IterTraits<Lib::RangeIterator<unsigned_int>>>::
  filter<Inferences::ALASCA::PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>>>::partitionSize(bool)::_lambda(auto:1)_1_>
            ((IterTraits<Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>_> *)
             in_stack_ffffffffffffffc8,in_stack_ffffffffffffffd0);
  uVar1 = Lib::
          IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/VariableElimination.cpp:182:15),_false>_>
          ::count(this_00);
  Lib::
  IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/VariableElimination.cpp:182:15),_false>_>
  ::~IterTraits((IterTraits<Lib::FilteredIterator<Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:182:15),_false>_>
                 *)0x71fdb8);
  return uVar1;
}

Assistant:

auto partitionSize(bool lhs) 
  { return iterTraits(range(0, (unsigned)_orig.size()))
      .filter([this, lhs](auto i) { return _partition.unwrap()[i] == lhs; })
      .count(); }